

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  long lVar1;
  size_t sVar2;
  _anonymous_namespace_ *this_00;
  size_t sVar3;
  pointer pcVar4;
  ostream *poVar5;
  size_t sVar6;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  Colour *this_01;
  long in_FS_OFFSET;
  Colour colour;
  allocator local_10a;
  allocator local_109;
  Colour colour_2;
  undefined1 local_e8 [40];
  Colour colour_1;
  undefined1 local_a0 [40];
  string local_78;
  string qualify_assertions_failed;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  poVar5 = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  sVar2 = (_testRunStats->totals).testCases.failed;
  sVar6 = (_testRunStats->totals).testCases.passed + sVar2 +
          (_testRunStats->totals).testCases.failedButOk;
  if (sVar6 == 0) {
    std::operator<<(poVar5,"No tests ran.");
  }
  else {
    if (sVar2 == sVar6) {
      colour.m_moved = false;
      Colour::use(BrightRed);
      this_00 = (_anonymous_namespace_ *)(_testRunStats->totals).assertions.failed;
      if (this_00 ==
          this_00 + (_testRunStats->totals).assertions.failedButOk +
                    (_testRunStats->totals).assertions.passed) {
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(&qualify_assertions_failed,this_00,count);
      }
      else {
        qualify_assertions_failed._M_dataplus._M_p = (pointer)&qualify_assertions_failed.field_2;
        qualify_assertions_failed._M_string_length = 0;
        qualify_assertions_failed.field_2._M_local_buf[0] = '\0';
      }
      poVar5 = std::operator<<(poVar5,"Failed ");
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)(_testRunStats->totals).testCases.failed,
                 count_01);
      poVar5 = std::operator<<(poVar5,(string *)&local_78);
      sVar2 = (_testRunStats->totals).testCases.failed;
      std::__cxx11::string::string((string *)&colour_1,"test case",&local_10a);
      local_a0._0_8_ = sVar2;
      std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&colour_1);
      Catch::operator<<(poVar5,(pluralise *)local_a0);
      poVar5 = std::operator<<(poVar5,", failed ");
      poVar5 = std::operator<<(poVar5,(string *)&qualify_assertions_failed);
      pcVar4 = (pointer)(_testRunStats->totals).assertions.failed;
      std::__cxx11::string::string((string *)&colour_2,"assertion",&local_109);
      local_e8._0_8_ = pcVar4;
      std::__cxx11::string::string((string *)(local_e8 + 8),(string *)&colour_2);
      Catch::operator<<(poVar5,(pluralise *)local_e8);
      std::operator<<(poVar5,'.');
      std::__cxx11::string::~string((string *)(local_e8 + 8));
      std::__cxx11::string::~string((string *)&colour_2);
      std::__cxx11::string::~string((string *)(local_a0 + 8));
      std::__cxx11::string::~string((string *)&colour_1);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&qualify_assertions_failed);
      this_01 = &colour;
    }
    else {
      sVar2 = (_testRunStats->totals).assertions.failed;
      if ((_testRunStats->totals).assertions.passed + sVar2 +
          (_testRunStats->totals).assertions.failedButOk == 0) {
        poVar5 = std::operator<<(poVar5,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                  ((string *)local_e8,
                   (_anonymous_namespace_ *)
                   ((_testRunStats->totals).testCases.failed +
                    (_testRunStats->totals).testCases.passed +
                   (_testRunStats->totals).testCases.failedButOk),count_00);
        poVar5 = std::operator<<(poVar5,(string *)local_e8);
        sVar2 = (_testRunStats->totals).testCases.passed;
        sVar6 = (_testRunStats->totals).testCases.failed;
        sVar3 = (_testRunStats->totals).testCases.failedButOk;
        std::__cxx11::string::string
                  ((string *)&qualify_assertions_failed,"test case",(allocator *)&local_78);
        local_a0._0_8_ = sVar6 + sVar2 + sVar3;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&qualify_assertions_failed);
        Catch::operator<<(poVar5,(pluralise *)local_a0);
        std::operator<<(poVar5," (no assertions).");
        std::__cxx11::string::~string((string *)(local_a0 + 8));
        std::__cxx11::string::~string((string *)&qualify_assertions_failed);
        std::__cxx11::string::~string((string *)local_e8);
        goto LAB_00184737;
      }
      if (sVar2 == 0) {
        colour_2.m_moved = false;
        Colour::use(BrightGreen);
        poVar5 = std::operator<<(poVar5,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                  (&qualify_assertions_failed,
                   (_anonymous_namespace_ *)(_testRunStats->totals).testCases.passed,count_02);
        poVar5 = std::operator<<(poVar5,(string *)&qualify_assertions_failed);
        sVar2 = (_testRunStats->totals).testCases.passed;
        std::__cxx11::string::string((string *)&local_78,"test case",(allocator *)&colour);
        local_a0._0_8_ = sVar2;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_78);
        Catch::operator<<(poVar5,(pluralise *)local_a0);
        poVar5 = std::operator<<(poVar5," with ");
        pcVar4 = (pointer)(_testRunStats->totals).assertions.passed;
        std::__cxx11::string::string((string *)&colour_1,"assertion",&local_10a);
        local_e8._0_8_ = pcVar4;
        std::__cxx11::string::string((string *)(local_e8 + 8),(string *)&colour_1);
        Catch::operator<<(poVar5,(pluralise *)local_e8);
        std::operator<<(poVar5,'.');
        std::__cxx11::string::~string((string *)(local_e8 + 8));
        std::__cxx11::string::~string((string *)&colour_1);
        std::__cxx11::string::~string((string *)(local_a0 + 8));
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&qualify_assertions_failed);
        this_01 = &colour_2;
      }
      else {
        colour_1.m_moved = false;
        Colour::use(BrightRed);
        poVar5 = std::operator<<(poVar5,"Failed ");
        sVar2 = (_testRunStats->totals).testCases.failed;
        std::__cxx11::string::string
                  ((string *)&qualify_assertions_failed,"test case",(allocator *)&colour_2);
        local_a0._0_8_ = sVar2;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&qualify_assertions_failed);
        Catch::operator<<(poVar5,(pluralise *)local_a0);
        poVar5 = std::operator<<(poVar5,", failed ");
        pcVar4 = (pointer)(_testRunStats->totals).assertions.failed;
        std::__cxx11::string::string((string *)&local_78,"assertion",(allocator *)&colour);
        local_e8._0_8_ = pcVar4;
        std::__cxx11::string::string((string *)(local_e8 + 8),(string *)&local_78);
        Catch::operator<<(poVar5,(pluralise *)local_e8);
        std::operator<<(poVar5,'.');
        std::__cxx11::string::~string((string *)(local_e8 + 8));
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)(local_a0 + 8));
        std::__cxx11::string::~string((string *)&qualify_assertions_failed);
        this_01 = &colour_1;
      }
    }
    Colour::~Colour(this_01);
  }
LAB_00184737:
  poVar5 = std::operator<<((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,'\n');
  std::endl<char,std::char_traits<char>>(poVar5);
  StreamingReporterBase<Catch::CompactReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::CompactReporter>,_testRunStats);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( stream, _testRunStats.totals );
            stream << '\n' << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }